

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void libtorrent::aux::anon_unknown_135::refresh_endpoint_list
               (session_interface *ses,bool is_ssl,bool complete_sent,announce_entry *ae)

{
  announce_endpoint *paVar1;
  const_iterator __last;
  bool bVar2;
  uint32_t uVar3;
  bool complete_sent_local;
  bool is_ssl_local;
  size_t valid_endpoints;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  complete_sent_local = complete_sent;
  is_ssl_local = is_ssl;
  bVar2 = is_i2p_url((string *)&ae->url);
  if (bVar2) {
    paVar1 = (ae->endpoints).
             super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (ae->endpoints).
         super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (1 < (ulong)(((long)__last._M_current - (long)paVar1) / 200)) {
      ::std::
      vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
      ::erase(&ae->endpoints,paVar1 + 1,__last);
      return;
    }
    if (paVar1 == __last._M_current) {
      valid_endpoints = 0;
      _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ::std::
      vector<libtorrent::aux::announce_endpoint,std::allocator<libtorrent::aux::announce_endpoint>>
      ::emplace_back<libtorrent::aux::listen_socket_handle,bool_const&>
                ((vector<libtorrent::aux::announce_endpoint,std::allocator<libtorrent::aux::announce_endpoint>>
                  *)&ae->endpoints,(listen_socket_handle *)&valid_endpoints,&complete_sent_local);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&_Stack_40);
    }
  }
  else {
    uVar3 = (*(ses->super_session_logger)._vptr_session_logger[0x23])(ses);
    if (uVar3 != ae->listen_socket_version) {
      valid_endpoints = 0;
      local_38._M_unused._M_object = (void *)0x0;
      local_38._8_8_ = 0;
      local_28 = (code *)0x0;
      pcStack_20 = (code *)0x0;
      local_38._M_unused._M_object = operator_new(0x20);
      *(bool **)local_38._M_unused._0_8_ = &is_ssl_local;
      *(announce_entry **)((long)local_38._M_unused._0_8_ + 8) = ae;
      *(size_t **)((long)local_38._M_unused._0_8_ + 0x10) = &valid_endpoints;
      *(bool **)((long)local_38._M_unused._0_8_ + 0x18) = &complete_sent_local;
      pcStack_20 = ::std::
                   _Function_handler<void_(const_libtorrent::aux::listen_socket_handle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:2913:30)>
                   ::_M_invoke;
      local_28 = ::std::
                 _Function_handler<void_(const_libtorrent::aux::listen_socket_handle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:2913:30)>
                 ::_M_manager;
      (*(ses->super_session_logger)._vptr_session_logger[0x24])(ses);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_38);
      ::std::
      vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
      ::erase(&ae->endpoints,
              (ae->endpoints).
              super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
              ._M_impl.super__Vector_impl_data._M_start + (int)valid_endpoints,
              (ae->endpoints).
              super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
              ._M_impl.super__Vector_impl_data._M_finish);
      ae->listen_socket_version = uVar3;
    }
  }
  return;
}

Assistant:

void refresh_endpoint_list(aux::session_interface& ses
		, bool const is_ssl, bool const complete_sent
		, aux::announce_entry& ae)
	{
#if TORRENT_USE_I2P
		if (is_i2p_url(ae.url))
		{
			if (ae.endpoints.size() > 1)
			{
				ae.endpoints.erase(ae.endpoints.begin() + 1, ae.endpoints.end());
			}
			else if (ae.endpoints.empty())
			{
				ae.endpoints.emplace_back(aux::listen_socket_handle(), complete_sent);
			}
			return;
		}
#endif

		auto const ver = ses.listen_socket_version();
		if (ver == ae.listen_socket_version)
			return;

		// update the endpoint list by adding entries for new listen sockets
		// and removing entries for non-existent ones
		std::size_t valid_endpoints = 0;
		ses.for_each_listen_socket([&](aux::listen_socket_handle const& s) {
			if (s.is_ssl() != is_ssl)
				return;
			for (auto& aep : ae.endpoints)
			{
				if (aep.socket != s) continue;
				std::swap(ae.endpoints[valid_endpoints], aep);
				valid_endpoints++;
				return;
			}

			ae.endpoints.emplace_back(s, complete_sent);
			std::swap(ae.endpoints[valid_endpoints], ae.endpoints.back());
			valid_endpoints++;
		});

#if TORRENT_USE_RTC
		if(auto pos = ae.url.find(':'); pos != string_view::npos)
		{
			string_view const protocol = string_view(ae.url).substr(0, pos);
			if (protocol == "ws" || protocol == "wss")
			{
				// WebSocket trackers will ignore the endpoint anyway
				valid_endpoints = std::min(valid_endpoints, std::size_t(1));
			}
		}
#endif

		TORRENT_ASSERT(valid_endpoints <= ae.endpoints.size());
		ae.endpoints.erase(ae.endpoints.begin() + int(valid_endpoints), ae.endpoints.end());
		ae.listen_socket_version = ver;
	}